

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cc
# Opt level: O2

int main(int param_1,char **param_2)

{
  ostream *poVar1;
  FILE *__stream;
  void *__buf;
  uchar *in_RCX;
  FILE *__n;
  size_t n;
  size_t n_00;
  int i;
  int iVar2;
  int __fd;
  Pl_MD5 *d_00;
  MD5 b;
  MD5 a;
  Pl_MD5 p;
  string local_108;
  Pl_Discard d;
  uchar buf [50];
  Pl_MD5 p2;
  
  test_string("");
  test_string("a");
  test_string("abc");
  test_string("message digest");
  test_string("abcdefghijklmnopqrstuvwxyz");
  test_string("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789");
  test_string("12345678901234567890123456789012345678901234567890123456789012345678901234567890");
  MD5::MD5(&a,(uchar *)param_2,n,in_RCX);
  MD5::encodeFile(&a,"md5.in",-1);
  MD5::unparse_abi_cxx11_((string *)&p,&a);
  d_00 = &p;
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)d_00);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&p);
  MD5::MD5(&b,(uchar *)d_00,n_00,in_RCX);
  MD5::encodeFile(&b,"md5.in",100);
  MD5::unparse_abi_cxx11_((string *)&p,&b);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&p);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&p);
  MD5::checkDataChecksum((MD5 *)"900150983cd24fb0d6963f7d28e17f72","abc",(char *)0x3,(size_t)in_RCX)
  ;
  poVar1 = std::ostream::_M_insert<bool>(true);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  MD5::checkFileChecksum
            ((MD5 *)"5f4b4321873433daae578f85c72f9e74","md5.in",(char *)0xffffffffffffffff,
             (qpdf_offset_t)in_RCX);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  MD5::checkFileChecksum
            ((MD5 *)"6f4b4321873433daae578f85c72f9e74","md5.in",(char *)0xffffffffffffffff,
             (qpdf_offset_t)in_RCX);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  MD5::checkDataChecksum((MD5 *)"000150983cd24fb0d6963f7d28e17f72","abc",(char *)0x3,(size_t)in_RCX)
  ;
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  MD5::checkFileChecksum
            ((MD5 *)"6f4b4321873433daae578f85c72f9e74","glerbl",(char *)0xffffffffffffffff,
             (qpdf_offset_t)in_RCX);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  Pl_Discard::Pl_Discard(&d);
  Pl_MD5::Pl_MD5(&p,"MD5",&d.super_Pipeline);
  Pl_MD5::Pl_MD5(&p2,"MD5",&d.super_Pipeline);
  Pl_MD5::persistAcrossFinish(&p2,true);
  iVar2 = 0;
  do {
    if (iVar2 == 2) {
      Pl_MD5::getHexDigest_abi_cxx11_((string *)buf,&p2);
      poVar1 = std::operator<<((ostream *)&std::cout,(string *)buf);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string((string *)buf);
      Pl_MD5::~Pl_MD5(&p2);
      Pl_MD5::~Pl_MD5(&p);
      Pl_Discard::~Pl_Discard(&d);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&b.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&a.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return 0;
    }
    __stream = (FILE *)QUtil::safe_fopen("md5.in","rb");
    do {
      __n = __stream;
      __buf = (void *)fread(buf,1,0x32,__stream);
      if (__buf == (void *)0x0) break;
      __fd = (int)buf;
      Pl_MD5::write(&p,__fd,__buf,(size_t)__n);
      Pl_MD5::write(&p2,__fd,__buf,(size_t)__n);
      if (iVar2 == 1) {
        Pl_MD5::getHexDigest_abi_cxx11_(&local_108,&p);
        poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_108);
        std::endl<char,std::char_traits<char>>(poVar1);
        std::__cxx11::string::~string((string *)&local_108);
      }
    } while (__buf != (void *)0x0);
    fclose(__stream);
    Pl_MD5::finish(&p);
    Pl_MD5::finish(&p2);
    Pl_MD5::getHexDigest_abi_cxx11_(&local_108,&p);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_108);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_108);
    Pl_MD5::getHexDigest_abi_cxx11_(&local_108,&p);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_108);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_108);
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

int
main(int, char*[])
{
    test_string("");
    test_string("a");
    test_string("abc");
    test_string("message digest");
    test_string("abcdefghijklmnopqrstuvwxyz");
    test_string(
        "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghi"
        "jklmnopqrstuvwxyz0123456789");
    test_string(
        "1234567890123456789012345678901234567890"
        "1234567890123456789012345678901234567890");
    MD5 a;
    a.encodeFile("md5.in");
    std::cout << a.unparse() << std::endl;
    MD5 b;
    b.encodeFile("md5.in", 100);
    std::cout << b.unparse() << std::endl;

    std::cout << MD5::checkDataChecksum("900150983cd24fb0d6963f7d28e17f72", "abc", 3) << std::endl
              << MD5::checkFileChecksum("5f4b4321873433daae578f85c72f9e74", "md5.in") << std::endl
              << MD5::checkFileChecksum("6f4b4321873433daae578f85c72f9e74", "md5.in") << std::endl
              << MD5::checkDataChecksum("000150983cd24fb0d6963f7d28e17f72", "abc", 3) << std::endl
              << MD5::checkFileChecksum("6f4b4321873433daae578f85c72f9e74", "glerbl") << std::endl;

    Pl_Discard d;
    Pl_MD5 p("MD5", &d);
    // Create a second pipeline, protect against finish, and call
    // getHexDigest only once at the end of both passes. Make sure the
    // checksum is that of the input file concatenated to itself. This
    // will require changes to Pl_MD5.cc to prevent finish from
    // calling finalize.
    Pl_MD5 p2("MD5", &d);
    p2.persistAcrossFinish(true);
    for (int i = 0; i < 2; ++i) {
        FILE* f = QUtil::safe_fopen("md5.in", "rb");
        // buffer size < size of md5.in
        unsigned char buf[50];
        bool done = false;
        while (!done) {
            size_t len = fread(buf, 1, sizeof(buf), f);
            if (len <= 0) {
                done = true;
            } else {
                p.write(buf, len);
                p2.write(buf, len);
                if (i == 1) {
                    // Partial digest -- resets after each call to write
                    std::cout << p.getHexDigest() << std::endl;
                }
            }
        }
        fclose(f);
        p.finish();
        p2.finish();
        // Make sure calling getHexDigest twice with no intervening
        // writes results in the same result each time.
        std::cout << p.getHexDigest() << std::endl;
        std::cout << p.getHexDigest() << std::endl;
    }
    std::cout << p2.getHexDigest() << std::endl;

    return 0;
}